

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersector1<4,_1048576,_false,_embree::avx2::ArrayIntersector1<embree::avx2::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  float fVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ulong uVar18;
  BaseNode *node;
  ulong uVar19;
  long lVar20;
  byte bVar21;
  undefined4 uVar22;
  uint uVar23;
  ulong *puVar24;
  ulong uVar25;
  ulong uVar26;
  undefined4 uVar27;
  RTCIntersectArguments *pRVar28;
  ulong *puVar29;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  vint4 ai_1;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 bi_1;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  vint4 bi;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  vint4 ai;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  float fVar94;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar92;
  float fVar93;
  undefined1 auVar91 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  float fVar106;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar107 [64];
  UVIdentity<4> mapUV;
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_ac9;
  undefined8 local_ac8;
  float fStack_ac0;
  float fStack_abc;
  int local_aac;
  undefined1 local_aa8 [16];
  Scene *local_a90;
  undefined1 local_a88 [16];
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  undefined1 local_a28 [16];
  long local_a18;
  long local_a10;
  undefined4 local_a08;
  undefined4 local_a04;
  undefined4 local_a00;
  undefined4 local_9fc;
  undefined4 local_9f8;
  undefined4 local_9f4;
  uint local_9f0;
  uint local_9ec;
  uint local_9e8;
  RTCFilterFunctionNArguments local_9d8;
  undefined1 local_9a8 [16];
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  undefined1 local_978 [16];
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8 != 8) {
    fVar4 = ray->tfar;
    if (0.0 <= fVar4) {
      puVar29 = local_7d0;
      auVar80 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar5 = (ray->dir).field_0;
      local_988._8_4_ = 0x7fffffff;
      local_988._0_8_ = 0x7fffffff7fffffff;
      local_988._12_4_ = 0x7fffffff;
      auVar63 = vandps_avx((undefined1  [16])aVar5,local_988);
      auVar68._8_4_ = 0x219392ef;
      auVar68._0_8_ = 0x219392ef219392ef;
      auVar68._12_4_ = 0x219392ef;
      auVar63 = vcmpps_avx(auVar63,auVar68,1);
      auVar63 = vblendvps_avx((undefined1  [16])aVar5,auVar68,auVar63);
      auVar68 = vrcpps_avx(auVar63);
      auVar69._8_4_ = 0x3f800000;
      auVar69._0_8_ = 0x3f8000003f800000;
      auVar69._12_4_ = 0x3f800000;
      auVar63 = vfnmadd213ps_fma(auVar63,auVar68,auVar69);
      auVar58 = vfmadd132ps_fma(auVar63,auVar68,auVar68);
      fVar53 = auVar58._0_4_;
      auVar91 = ZEXT1664(CONCAT412(fVar53,CONCAT48(fVar53,CONCAT44(fVar53,fVar53))));
      auVar63 = vmovshdup_avx(auVar58);
      auVar68 = vshufps_avx(auVar58,auVar58,0x55);
      auVar96 = ZEXT1664(auVar68);
      auVar68 = vshufpd_avx(auVar58,auVar58,1);
      auVar69 = vshufps_avx(auVar58,auVar58,0xaa);
      auVar97 = ZEXT1664(auVar69);
      auVar54._0_4_ = fVar53 * (ray->org).field_0.m128[0];
      auVar54._4_4_ = auVar58._4_4_ * (ray->org).field_0.m128[1];
      auVar54._8_4_ = auVar58._8_4_ * (ray->org).field_0.m128[2];
      auVar54._12_4_ = auVar58._12_4_ * (ray->org).field_0.m128[3];
      auVar69 = vshufps_avx(auVar54,auVar54,0x55);
      auVar58 = vshufps_avx(auVar54,auVar54,0xaa);
      uVar26 = (ulong)(fVar53 < 0.0) << 2;
      uVar1 = (ulong)(auVar63._0_4_ < 0.0) * 4 + 8;
      uVar2 = (ulong)(auVar68._0_4_ < 0.0) * 4 + 0x10;
      uVar30 = uVar26 ^ 4;
      local_998._8_4_ = 0x80000000;
      local_998._0_8_ = 0x8000000080000000;
      local_998._12_4_ = 0x80000000;
      uVar31 = CONCAT44(auVar54._0_4_,auVar54._0_4_);
      auVar99 = ZEXT1664(CONCAT412(-auVar54._0_4_,
                                   CONCAT48(-auVar54._0_4_,uVar31 ^ 0x8000000080000000)));
      auVar100 = ZEXT1664(CONCAT412(auVar69._12_4_ ^ 0x80000000,
                                    CONCAT48(auVar69._8_4_ ^ 0x80000000,
                                             auVar69._0_8_ ^ 0x8000000080000000)));
      auVar103 = ZEXT1664(CONCAT412(auVar58._12_4_ ^ 0x80000000,
                                    CONCAT48(auVar58._8_4_ ^ 0x80000000,
                                             auVar58._0_8_ ^ 0x8000000080000000)));
      uVar22 = auVar80._0_4_;
      auVar105 = ZEXT1664(CONCAT412(uVar22,CONCAT48(uVar22,CONCAT44(uVar22,uVar22))));
      auVar107 = ZEXT1664(CONCAT412(fVar4,CONCAT48(fVar4,CONCAT44(fVar4,fVar4))));
      local_9a8 = mm_lookupmask_ps._240_16_;
      do {
        uVar31 = puVar29[-1];
        puVar29 = puVar29 + -1;
        while( true ) {
          local_908 = auVar91._0_16_;
          local_938 = auVar99._0_16_;
          local_918 = auVar96._0_16_;
          local_948 = auVar100._0_16_;
          local_928 = auVar97._0_16_;
          local_958 = auVar103._0_16_;
          if ((uVar31 & 8) != 0) break;
          uVar19 = uVar31 & 0xfffffffffffffff0;
          puVar24 = (ulong *)(uVar19 + 0x20);
          if (uVar19 == 0) {
            puVar24 = (ulong *)0x0;
          }
          uVar22 = (undefined4)puVar24[3];
          auVar46._4_4_ = uVar22;
          auVar46._0_4_ = uVar22;
          auVar46._8_4_ = uVar22;
          auVar46._12_4_ = uVar22;
          uVar22 = *(undefined4 *)((long)puVar24 + 0x24);
          auVar55._4_4_ = uVar22;
          auVar55._0_4_ = uVar22;
          auVar55._8_4_ = uVar22;
          auVar55._12_4_ = uVar22;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = *(ulong *)((long)puVar24 + uVar26);
          auVar63 = vpmovzxbd_avx(auVar33);
          auVar63 = vcvtdq2ps_avx(auVar63);
          auVar68 = vfmadd213ps_fma(auVar63,auVar55,auVar46);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *(ulong *)((long)puVar24 + uVar30);
          auVar63 = vpmovzxbd_avx(auVar34);
          auVar63 = vcvtdq2ps_avx(auVar63);
          auVar69 = vfmadd213ps_fma(auVar63,auVar55,auVar46);
          uVar22 = *(undefined4 *)((long)puVar24 + 0x1c);
          auVar60._4_4_ = uVar22;
          auVar60._0_4_ = uVar22;
          auVar60._8_4_ = uVar22;
          auVar60._12_4_ = uVar22;
          uVar22 = (undefined4)puVar24[5];
          auVar70._4_4_ = uVar22;
          auVar70._0_4_ = uVar22;
          auVar70._8_4_ = uVar22;
          auVar70._12_4_ = uVar22;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = *(ulong *)((long)puVar24 + uVar1);
          auVar63 = vpmovzxbd_avx(auVar47);
          auVar63 = vcvtdq2ps_avx(auVar63);
          auVar58 = vfmadd213ps_fma(auVar63,auVar70,auVar60);
          auVar48._8_8_ = 0;
          auVar48._0_8_ = *(ulong *)((long)puVar24 + (uVar1 ^ 4));
          auVar63 = vpmovzxbd_avx(auVar48);
          auVar63 = vcvtdq2ps_avx(auVar63);
          auVar54 = vfmadd213ps_fma(auVar63,auVar70,auVar60);
          uVar22 = (undefined4)puVar24[4];
          auVar61._4_4_ = uVar22;
          auVar61._0_4_ = uVar22;
          auVar61._8_4_ = uVar22;
          auVar61._12_4_ = uVar22;
          uVar22 = *(undefined4 *)((long)puVar24 + 0x2c);
          auVar71._4_4_ = uVar22;
          auVar71._0_4_ = uVar22;
          auVar71._8_4_ = uVar22;
          auVar71._12_4_ = uVar22;
          auVar78._8_8_ = 0;
          auVar78._0_8_ = *(ulong *)((long)puVar24 + uVar2);
          auVar63 = vpmovzxbd_avx(auVar78);
          auVar63 = vcvtdq2ps_avx(auVar63);
          auVar64 = vfmadd213ps_fma(auVar63,auVar71,auVar61);
          auVar84._8_8_ = 0;
          auVar84._0_8_ = *(ulong *)((long)puVar24 + (uVar2 ^ 4));
          auVar63 = vpmovzxbd_avx(auVar84);
          auVar63 = vcvtdq2ps_avx(auVar63);
          auVar41 = vfmadd213ps_fma(auVar63,auVar71,auVar61);
          auVar62._8_8_ = 0;
          auVar62._0_8_ = *puVar24;
          auVar72._8_8_ = 0;
          auVar72._0_8_ = *(ulong *)((long)puVar24 + 4);
          auVar80 = vpminub_avx(auVar62,auVar72);
          auVar63 = vpcmpeqb_avx(auVar62,auVar80);
          auVar80 = vpcmpeqd_avx(auVar80,auVar80);
          auVar63 = vpmovzxbd_avx(auVar63 ^ auVar80);
          auVar63 = vpslld_avx(auVar63 ^ auVar80,0x1f);
          uVar27 = vmovmskps_avx(auVar63);
          auVar63 = vfmadd213ps_fma(auVar68,local_908,local_938);
          auVar80 = vfmadd213ps_fma(auVar58,local_918,local_948);
          auVar63 = vpmaxsd_avx(auVar63,auVar80);
          auVar80 = vfmadd213ps_fma(auVar64,local_928,local_958);
          auVar80 = vpmaxsd_avx(auVar80,auVar105._0_16_);
          auVar63 = vpmaxsd_avx(auVar63,auVar80);
          auVar80 = vfmadd213ps_fma(auVar69,local_908,local_938);
          auVar68 = vfmadd213ps_fma(auVar54,local_918,local_948);
          auVar80 = vpminsd_avx(auVar80,auVar68);
          auVar68 = vfmadd213ps_fma(auVar41,local_928,local_958);
          auVar68 = vpminsd_avx(auVar68,auVar107._0_16_);
          auVar80 = vpminsd_avx(auVar80,auVar68);
          auVar63 = vpcmpgtd_avx(auVar63,auVar80);
          uVar22 = vmovmskps_avx(auVar63);
          bVar21 = ~(byte)uVar22 & (byte)uVar27;
          if (bVar21 == 0) goto LAB_004c2261;
          lVar20 = 0;
          for (uVar31 = (ulong)bVar21; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000)
          {
            lVar20 = lVar20 + 1;
          }
          uVar31 = *(ulong *)(uVar19 + lVar20 * 8);
          uVar23 = bVar21 - 1 & (uint)bVar21;
          uVar25 = (ulong)uVar23;
          if (uVar23 != 0) {
            *puVar29 = uVar31;
            lVar20 = 0;
            for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
              lVar20 = lVar20 + 1;
            }
            uVar23 = uVar23 - 1 & uVar23;
            uVar25 = (ulong)uVar23;
            bVar32 = uVar23 == 0;
            while( true ) {
              puVar29 = puVar29 + 1;
              uVar31 = *(ulong *)(uVar19 + lVar20 * 8);
              if (bVar32) break;
              *puVar29 = uVar31;
              lVar20 = 0;
              for (uVar31 = uVar25; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
                lVar20 = lVar20 + 1;
              }
              uVar25 = uVar25 - 1 & uVar25;
              bVar32 = uVar25 == 0;
            }
          }
        }
        local_a18 = (ulong)((uint)uVar31 & 0xf) - 8;
        if (local_a18 != 0) {
          uVar31 = uVar31 & 0xfffffffffffffff0;
          local_a10 = 0;
          local_968 = auVar105._0_16_;
          local_978 = auVar107._0_16_;
          local_a90 = context->scene;
          do {
            lVar20 = local_a10 * 0x50;
            ppfVar6 = (local_a90->vertices).items;
            pfVar7 = ppfVar6[*(uint *)(uVar31 + 0x30 + lVar20)];
            pfVar8 = ppfVar6[*(uint *)(uVar31 + 0x34 + lVar20)];
            pfVar9 = ppfVar6[*(uint *)(uVar31 + 0x38 + lVar20)];
            pfVar10 = ppfVar6[*(uint *)(uVar31 + 0x3c + lVar20)];
            auVar68 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar31 + lVar20)),
                                    *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar31 + 8 + lVar20)))
            ;
            auVar63 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar31 + lVar20)),
                                    *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar31 + 8 + lVar20)))
            ;
            auVar69 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar31 + 4 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar31 + 0xc + lVar20)));
            auVar80 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar31 + 4 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar31 + 0xc + lVar20)));
            auVar54 = vunpcklps_avx(auVar63,auVar80);
            auVar64 = vunpcklps_avx(auVar68,auVar69);
            auVar63 = vunpckhps_avx(auVar68,auVar69);
            auVar69 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar31 + 0x10 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar31 + 0x18 + lVar20)));
            auVar80 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar31 + 0x10 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar31 + 0x18 + lVar20)));
            auVar58 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar31 + 0x14 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar31 + 0x1c + lVar20)));
            auVar68 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar31 + 0x14 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar31 + 0x1c + lVar20)));
            auVar41 = vunpcklps_avx(auVar80,auVar68);
            auVar35 = vunpcklps_avx(auVar69,auVar58);
            auVar80 = vunpckhps_avx(auVar69,auVar58);
            auVar58 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar31 + 0x20 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar31 + 0x28 + lVar20)));
            auVar68 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar31 + 0x20 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar31 + 0x28 + lVar20)));
            auVar36 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar31 + 0x24 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar31 + 0x2c + lVar20)));
            auVar69 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar31 + 0x24 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar31 + 0x2c + lVar20)));
            auVar37 = vunpcklps_avx(auVar68,auVar69);
            auVar69 = vunpcklps_avx(auVar58,auVar36);
            auVar58 = vunpckhps_avx(auVar58,auVar36);
            puVar3 = (undefined8 *)(uVar31 + 0x30 + lVar20);
            local_898 = *puVar3;
            uStack_890 = puVar3[1];
            puVar3 = (undefined8 *)(uVar31 + 0x40 + lVar20);
            local_8a8 = *puVar3;
            uStack_8a0 = puVar3[1];
            uVar22 = *(undefined4 *)&(ray->org).field_0;
            auVar98._4_4_ = uVar22;
            auVar98._0_4_ = uVar22;
            auVar98._8_4_ = uVar22;
            auVar98._12_4_ = uVar22;
            uVar22 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar101._4_4_ = uVar22;
            auVar101._0_4_ = uVar22;
            auVar101._8_4_ = uVar22;
            auVar101._12_4_ = uVar22;
            uVar22 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar104._4_4_ = uVar22;
            auVar104._0_4_ = uVar22;
            auVar104._8_4_ = uVar22;
            auVar104._12_4_ = uVar22;
            local_a28 = vsubps_avx(auVar64,auVar98);
            local_a38 = vsubps_avx(auVar63,auVar101);
            local_a48 = vsubps_avx(auVar54,auVar104);
            auVar63 = vsubps_avx(auVar35,auVar98);
            auVar80 = vsubps_avx(auVar80,auVar101);
            auVar68 = vsubps_avx(auVar41,auVar104);
            auVar69 = vsubps_avx(auVar69,auVar98);
            auVar58 = vsubps_avx(auVar58,auVar101);
            auVar54 = vsubps_avx(auVar37,auVar104);
            local_a58 = vsubps_avx(auVar69,local_a28);
            local_a78 = vsubps_avx(auVar58,local_a38);
            local_a68 = vsubps_avx(auVar54,local_a48);
            auVar35._0_4_ = auVar69._0_4_ + local_a28._0_4_;
            auVar35._4_4_ = auVar69._4_4_ + local_a28._4_4_;
            auVar35._8_4_ = auVar69._8_4_ + local_a28._8_4_;
            auVar35._12_4_ = auVar69._12_4_ + local_a28._12_4_;
            auVar56._0_4_ = auVar58._0_4_ + local_a38._0_4_;
            auVar56._4_4_ = auVar58._4_4_ + local_a38._4_4_;
            auVar56._8_4_ = auVar58._8_4_ + local_a38._8_4_;
            auVar56._12_4_ = auVar58._12_4_ + local_a38._12_4_;
            fVar4 = local_a48._0_4_;
            auVar64._0_4_ = auVar54._0_4_ + fVar4;
            fVar53 = local_a48._4_4_;
            auVar64._4_4_ = auVar54._4_4_ + fVar53;
            fVar12 = local_a48._8_4_;
            auVar64._8_4_ = auVar54._8_4_ + fVar12;
            fVar13 = local_a48._12_4_;
            auVar64._12_4_ = auVar54._12_4_ + fVar13;
            auVar102._0_4_ = local_a68._0_4_ * auVar56._0_4_;
            auVar102._4_4_ = local_a68._4_4_ * auVar56._4_4_;
            auVar102._8_4_ = local_a68._8_4_ * auVar56._8_4_;
            auVar102._12_4_ = local_a68._12_4_ * auVar56._12_4_;
            auVar41 = vfmsub231ps_fma(auVar102,local_a78,auVar64);
            auVar65._0_4_ = local_a58._0_4_ * auVar64._0_4_;
            auVar65._4_4_ = local_a58._4_4_ * auVar64._4_4_;
            auVar65._8_4_ = local_a58._8_4_ * auVar64._8_4_;
            auVar65._12_4_ = local_a58._12_4_ * auVar64._12_4_;
            auVar64 = vfmsub231ps_fma(auVar65,local_a68,auVar35);
            auVar36._0_4_ = local_a78._0_4_ * auVar35._0_4_;
            auVar36._4_4_ = local_a78._4_4_ * auVar35._4_4_;
            auVar36._8_4_ = local_a78._8_4_ * auVar35._8_4_;
            auVar36._12_4_ = local_a78._12_4_ * auVar35._12_4_;
            auVar35 = vfmsub231ps_fma(auVar36,local_a58,auVar56);
            local_ac8._4_4_ = (ray->dir).field_0.m128[2];
            auVar37._0_4_ = local_ac8._4_4_ * auVar35._0_4_;
            auVar37._4_4_ = local_ac8._4_4_ * auVar35._4_4_;
            auVar37._8_4_ = local_ac8._4_4_ * auVar35._8_4_;
            auVar37._12_4_ = local_ac8._4_4_ * auVar35._12_4_;
            uVar22 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
            auVar95._4_4_ = uVar22;
            auVar95._0_4_ = uVar22;
            auVar95._8_4_ = uVar22;
            auVar95._12_4_ = uVar22;
            auVar64 = vfmadd231ps_fma(auVar37,auVar95,auVar64);
            uVar22 = *(undefined4 *)&(ray->dir).field_0;
            local_aa8._4_4_ = uVar22;
            local_aa8._0_4_ = uVar22;
            local_aa8._8_4_ = uVar22;
            local_aa8._12_4_ = uVar22;
            local_8d8 = vfmadd231ps_fma(auVar64,local_aa8,auVar41);
            local_a88 = vsubps_avx(local_a38,auVar80);
            local_8c8 = vsubps_avx(local_a48,auVar68);
            auVar57._0_4_ = auVar80._0_4_ + local_a38._0_4_;
            auVar57._4_4_ = auVar80._4_4_ + local_a38._4_4_;
            auVar57._8_4_ = auVar80._8_4_ + local_a38._8_4_;
            auVar57._12_4_ = auVar80._12_4_ + local_a38._12_4_;
            auVar85._0_4_ = auVar68._0_4_ + fVar4;
            auVar85._4_4_ = auVar68._4_4_ + fVar53;
            auVar85._8_4_ = auVar68._8_4_ + fVar12;
            auVar85._12_4_ = auVar68._12_4_ + fVar13;
            fVar14 = local_8c8._0_4_;
            auVar79._0_4_ = auVar57._0_4_ * fVar14;
            fVar15 = local_8c8._4_4_;
            auVar79._4_4_ = auVar57._4_4_ * fVar15;
            fVar16 = local_8c8._8_4_;
            auVar79._8_4_ = auVar57._8_4_ * fVar16;
            fVar17 = local_8c8._12_4_;
            auVar79._12_4_ = auVar57._12_4_ * fVar17;
            auVar41 = vfmsub231ps_fma(auVar79,local_a88,auVar85);
            local_8b8 = vsubps_avx(local_a28,auVar63);
            fVar106 = local_8b8._0_4_;
            auVar86._0_4_ = fVar106 * auVar85._0_4_;
            fVar108 = local_8b8._4_4_;
            auVar86._4_4_ = fVar108 * auVar85._4_4_;
            fVar109 = local_8b8._8_4_;
            auVar86._8_4_ = fVar109 * auVar85._8_4_;
            fVar110 = local_8b8._12_4_;
            auVar86._12_4_ = fVar110 * auVar85._12_4_;
            auVar40._0_4_ = auVar63._0_4_ + local_a28._0_4_;
            auVar40._4_4_ = auVar63._4_4_ + local_a28._4_4_;
            auVar40._8_4_ = auVar63._8_4_ + local_a28._8_4_;
            auVar40._12_4_ = auVar63._12_4_ + local_a28._12_4_;
            auVar64 = vfmsub231ps_fma(auVar86,local_8c8,auVar40);
            fVar88 = local_a88._0_4_;
            auVar66._0_4_ = fVar88 * auVar40._0_4_;
            fVar92 = local_a88._4_4_;
            auVar66._4_4_ = fVar92 * auVar40._4_4_;
            fVar93 = local_a88._8_4_;
            auVar66._8_4_ = fVar93 * auVar40._8_4_;
            fVar94 = local_a88._12_4_;
            auVar66._12_4_ = fVar94 * auVar40._12_4_;
            auVar35 = vfmsub231ps_fma(auVar66,local_8b8,auVar57);
            auVar67._0_4_ = local_ac8._4_4_ * auVar35._0_4_;
            auVar67._4_4_ = local_ac8._4_4_ * auVar35._4_4_;
            auVar67._8_4_ = local_ac8._4_4_ * auVar35._8_4_;
            auVar67._12_4_ = local_ac8._4_4_ * auVar35._12_4_;
            auVar64 = vfmadd231ps_fma(auVar67,auVar95,auVar64);
            local_878 = vfmadd231ps_fma(auVar64,local_aa8,auVar41);
            auVar64 = vsubps_avx(auVar63,auVar69);
            auVar49._0_4_ = auVar63._0_4_ + auVar69._0_4_;
            auVar49._4_4_ = auVar63._4_4_ + auVar69._4_4_;
            auVar49._8_4_ = auVar63._8_4_ + auVar69._8_4_;
            auVar49._12_4_ = auVar63._12_4_ + auVar69._12_4_;
            auVar69 = vsubps_avx(auVar80,auVar58);
            auVar41._0_4_ = auVar80._0_4_ + auVar58._0_4_;
            auVar41._4_4_ = auVar80._4_4_ + auVar58._4_4_;
            auVar41._8_4_ = auVar80._8_4_ + auVar58._8_4_;
            auVar41._12_4_ = auVar80._12_4_ + auVar58._12_4_;
            auVar58 = vsubps_avx(auVar68,auVar54);
            auVar63._0_4_ = auVar68._0_4_ + auVar54._0_4_;
            auVar63._4_4_ = auVar68._4_4_ + auVar54._4_4_;
            auVar63._8_4_ = auVar68._8_4_ + auVar54._8_4_;
            auVar63._12_4_ = auVar68._12_4_ + auVar54._12_4_;
            auVar80._0_4_ = auVar58._0_4_ * auVar41._0_4_;
            auVar80._4_4_ = auVar58._4_4_ * auVar41._4_4_;
            auVar80._8_4_ = auVar58._8_4_ * auVar41._8_4_;
            auVar80._12_4_ = auVar58._12_4_ * auVar41._12_4_;
            auVar80 = vfmsub231ps_fma(auVar80,auVar69,auVar63);
            auVar73._0_4_ = auVar63._0_4_ * auVar64._0_4_;
            auVar73._4_4_ = auVar63._4_4_ * auVar64._4_4_;
            auVar73._8_4_ = auVar63._8_4_ * auVar64._8_4_;
            auVar73._12_4_ = auVar63._12_4_ * auVar64._12_4_;
            auVar63 = vfmsub231ps_fma(auVar73,auVar58,auVar49);
            auVar50._0_4_ = auVar69._0_4_ * auVar49._0_4_;
            auVar50._4_4_ = auVar69._4_4_ * auVar49._4_4_;
            auVar50._8_4_ = auVar69._8_4_ * auVar49._8_4_;
            auVar50._12_4_ = auVar69._12_4_ * auVar49._12_4_;
            auVar68 = vfmsub231ps_fma(auVar50,auVar64,auVar41);
            local_ac8._0_4_ = local_ac8._4_4_;
            fStack_ac0 = local_ac8._4_4_;
            fStack_abc = local_ac8._4_4_;
            auVar42._0_4_ = local_ac8._4_4_ * auVar68._0_4_;
            auVar42._4_4_ = local_ac8._4_4_ * auVar68._4_4_;
            auVar42._8_4_ = local_ac8._4_4_ * auVar68._8_4_;
            auVar42._12_4_ = local_ac8._4_4_ * auVar68._12_4_;
            auVar63 = vfmadd231ps_fma(auVar42,auVar95,auVar63);
            auVar68 = vfmadd231ps_fma(auVar63,local_aa8,auVar80);
            local_888 = local_8d8._0_4_;
            fStack_884 = local_8d8._4_4_;
            fStack_880 = local_8d8._8_4_;
            fStack_87c = local_8d8._12_4_;
            local_868._0_4_ = auVar68._0_4_ + local_888 + local_878._0_4_;
            local_868._4_4_ = auVar68._4_4_ + fStack_884 + local_878._4_4_;
            local_868._8_4_ = auVar68._8_4_ + fStack_880 + local_878._8_4_;
            local_868._12_4_ = auVar68._12_4_ + fStack_87c + local_878._12_4_;
            auVar63 = vminps_avx(local_8d8,local_878);
            auVar63 = vminps_avx(auVar63,auVar68);
            local_8e8 = vandps_avx(local_868,local_988);
            auVar74._0_4_ = local_8e8._0_4_ * 1.1920929e-07;
            auVar74._4_4_ = local_8e8._4_4_ * 1.1920929e-07;
            auVar74._8_4_ = local_8e8._8_4_ * 1.1920929e-07;
            auVar74._12_4_ = local_8e8._12_4_ * 1.1920929e-07;
            auVar81._0_4_ = (uint)auVar74._0_4_ ^ local_998._0_4_;
            auVar81._4_4_ = (uint)auVar74._4_4_ ^ local_998._4_4_;
            auVar81._8_4_ = (uint)auVar74._8_4_ ^ local_998._8_4_;
            auVar81._12_4_ = (uint)auVar74._12_4_ ^ local_998._12_4_;
            auVar63 = vcmpps_avx(auVar63,auVar81,5);
            auVar80 = vmaxps_avx(local_8d8,local_878);
            auVar80 = vmaxps_avx(auVar80,auVar68);
            auVar80 = vcmpps_avx(auVar80,auVar74,2);
            local_8f8 = vorps_avx(auVar63,auVar80);
            local_ac9 = 0;
            auVar63 = local_9a8 & local_8f8;
            if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar63[0xf] < '\0') {
              auVar43._0_4_ = local_a68._0_4_ * fVar88;
              auVar43._4_4_ = local_a68._4_4_ * fVar92;
              auVar43._8_4_ = local_a68._8_4_ * fVar93;
              auVar43._12_4_ = local_a68._12_4_ * fVar94;
              auVar51._0_4_ = local_a78._0_4_ * fVar106;
              auVar51._4_4_ = local_a78._4_4_ * fVar108;
              auVar51._8_4_ = local_a78._8_4_ * fVar109;
              auVar51._12_4_ = local_a78._12_4_ * fVar110;
              auVar68 = vfmsub213ps_fma(local_a78,local_8c8,auVar43);
              auVar75._0_4_ = fVar14 * auVar69._0_4_;
              auVar75._4_4_ = fVar15 * auVar69._4_4_;
              auVar75._8_4_ = fVar16 * auVar69._8_4_;
              auVar75._12_4_ = fVar17 * auVar69._12_4_;
              auVar82._0_4_ = fVar106 * auVar58._0_4_;
              auVar82._4_4_ = fVar108 * auVar58._4_4_;
              auVar82._8_4_ = fVar109 * auVar58._8_4_;
              auVar82._12_4_ = fVar110 * auVar58._12_4_;
              auVar58 = vfmsub213ps_fma(auVar58,local_a88,auVar75);
              auVar63 = vandps_avx(auVar43,local_988);
              auVar80 = vandps_avx(auVar75,local_988);
              auVar63 = vcmpps_avx(auVar63,auVar80,1);
              local_808 = vblendvps_avx(auVar58,auVar68,auVar63);
              auVar76._0_4_ = fVar88 * auVar64._0_4_;
              auVar76._4_4_ = fVar92 * auVar64._4_4_;
              auVar76._8_4_ = fVar93 * auVar64._8_4_;
              auVar76._12_4_ = fVar94 * auVar64._12_4_;
              auVar68 = vfmsub213ps_fma(auVar64,local_8c8,auVar82);
              auVar44._0_4_ = local_a58._0_4_ * fVar14;
              auVar44._4_4_ = local_a58._4_4_ * fVar15;
              auVar44._8_4_ = local_a58._8_4_ * fVar16;
              auVar44._12_4_ = local_a58._12_4_ * fVar17;
              auVar58 = vfmsub213ps_fma(local_a68,local_8b8,auVar44);
              auVar63 = vandps_avx(auVar44,local_988);
              auVar80 = vandps_avx(auVar82,local_988);
              auVar63 = vcmpps_avx(auVar63,auVar80,1);
              local_7f8 = vblendvps_avx(auVar68,auVar58,auVar63);
              auVar68 = vfmsub213ps_fma(local_a58,local_a88,auVar51);
              auVar69 = vfmsub213ps_fma(auVar69,local_8b8,auVar76);
              auVar63 = vandps_avx(auVar51,local_988);
              auVar80 = vandps_avx(auVar76,local_988);
              auVar63 = vcmpps_avx(auVar63,auVar80,1);
              local_7e8 = vblendvps_avx(auVar69,auVar68,auVar63);
              auVar58._0_4_ = local_7e8._0_4_ * local_ac8._4_4_;
              auVar58._4_4_ = local_7e8._4_4_ * local_ac8._4_4_;
              auVar58._8_4_ = local_7e8._8_4_ * local_ac8._4_4_;
              auVar58._12_4_ = local_7e8._12_4_ * local_ac8._4_4_;
              auVar63 = vfmadd213ps_fma(auVar95,local_7f8,auVar58);
              auVar63 = vfmadd213ps_fma(local_aa8,local_808,auVar63);
              auVar77._0_4_ = auVar63._0_4_ + auVar63._0_4_;
              auVar77._4_4_ = auVar63._4_4_ + auVar63._4_4_;
              auVar77._8_4_ = auVar63._8_4_ + auVar63._8_4_;
              auVar77._12_4_ = auVar63._12_4_ + auVar63._12_4_;
              auVar59._0_4_ = local_7e8._0_4_ * fVar4;
              auVar59._4_4_ = local_7e8._4_4_ * fVar53;
              auVar59._8_4_ = local_7e8._8_4_ * fVar12;
              auVar59._12_4_ = local_7e8._12_4_ * fVar13;
              auVar63 = vfmadd213ps_fma(local_a38,local_7f8,auVar59);
              auVar80 = vfmadd213ps_fma(local_a28,local_808,auVar63);
              auVar63 = vrcpps_avx(auVar77);
              auVar87._8_4_ = 0x3f800000;
              auVar87._0_8_ = 0x3f8000003f800000;
              auVar87._12_4_ = 0x3f800000;
              auVar68 = vfnmadd213ps_fma(auVar63,auVar77,auVar87);
              auVar63 = vfmadd132ps_fma(auVar68,auVar63,auVar63);
              local_818._0_4_ = auVar63._0_4_ * (auVar80._0_4_ + auVar80._0_4_);
              local_818._4_4_ = auVar63._4_4_ * (auVar80._4_4_ + auVar80._4_4_);
              local_818._8_4_ = auVar63._8_4_ * (auVar80._8_4_ + auVar80._8_4_);
              local_818._12_4_ = auVar63._12_4_ * (auVar80._12_4_ + auVar80._12_4_);
              uVar22 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
              auVar83._4_4_ = uVar22;
              auVar83._0_4_ = uVar22;
              auVar83._8_4_ = uVar22;
              auVar83._12_4_ = uVar22;
              auVar63 = vcmpps_avx(auVar83,local_818,2);
              fVar4 = ray->tfar;
              auVar89._4_4_ = fVar4;
              auVar89._0_4_ = fVar4;
              auVar89._8_4_ = fVar4;
              auVar89._12_4_ = fVar4;
              auVar80 = vcmpps_avx(local_818,auVar89,2);
              auVar63 = vandps_avx(auVar80,auVar63);
              auVar90._0_4_ = (uint)auVar77._0_4_ ^ local_998._0_4_;
              auVar90._4_4_ = (uint)auVar77._4_4_ ^ local_998._4_4_;
              auVar90._8_4_ = (uint)auVar77._8_4_ ^ local_998._8_4_;
              auVar90._12_4_ = (uint)auVar77._12_4_ ^ local_998._12_4_;
              auVar80 = vcmpps_avx(auVar90,auVar77,4);
              auVar63 = vandps_avx(auVar80,auVar63);
              auVar80 = vpand_avx(local_8f8,local_9a8);
              auVar63 = vpslld_avx(auVar63,0x1f);
              auVar63 = vpsrad_avx(auVar63,0x1f);
              local_848 = vpand_avx(auVar63,auVar80);
              uVar23 = vmovmskps_avx(local_848);
              if (uVar23 != 0) {
                local_858 = &local_ac9;
                auVar63 = vrcpps_avx(local_868);
                auVar52._8_4_ = 0x3f800000;
                auVar52._0_8_ = 0x3f8000003f800000;
                auVar52._12_4_ = 0x3f800000;
                auVar80 = vfnmadd213ps_fma(local_868,auVar63,auVar52);
                auVar80 = vfmadd132ps_fma(auVar80,auVar63,auVar63);
                auVar45._8_4_ = 0x219392ef;
                auVar45._0_8_ = 0x219392ef219392ef;
                auVar45._12_4_ = 0x219392ef;
                auVar63 = vcmpps_avx(local_8e8,auVar45,5);
                auVar63 = vandps_avx(auVar80,auVar63);
                auVar38._0_4_ = local_888 * auVar63._0_4_;
                auVar38._4_4_ = fStack_884 * auVar63._4_4_;
                auVar38._8_4_ = fStack_880 * auVar63._8_4_;
                auVar38._12_4_ = fStack_87c * auVar63._12_4_;
                local_838 = vminps_avx(auVar38,auVar52);
                auVar39._0_4_ = auVar63._0_4_ * local_878._0_4_;
                auVar39._4_4_ = auVar63._4_4_ * local_878._4_4_;
                auVar39._8_4_ = auVar63._8_4_ * local_878._8_4_;
                auVar39._12_4_ = auVar63._12_4_ * local_878._12_4_;
                local_828 = vminps_avx(auVar39,auVar52);
                uVar19 = (ulong)(uVar23 & 0xff);
                do {
                  uVar25 = 0;
                  for (uVar18 = uVar19; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000
                      ) {
                    uVar25 = uVar25 + 1;
                  }
                  local_9f0 = *(uint *)((long)&local_898 + uVar25 * 4);
                  pGVar11 = (local_a90->geometries).items[local_9f0].ptr;
                  if ((pGVar11->mask & ray->mask) == 0) {
                    uVar19 = uVar19 ^ 1L << (uVar25 & 0x3f);
                  }
                  else {
                    pRVar28 = context->args;
                    if ((pRVar28->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_004c2271;
                    local_a48._0_8_ = uVar19;
                    local_a38._0_8_ = uVar26;
                    local_a28._0_8_ = puVar29;
                    local_a58._0_8_ = uVar25;
                    uVar26 = (ulong)(uint)((int)uVar25 * 4);
                    local_aa8._0_8_ = context;
                    local_9d8.context = context->user;
                    local_a08 = *(undefined4 *)(local_808 + uVar26);
                    local_a04 = *(undefined4 *)(local_7f8 + uVar26);
                    local_a00 = *(undefined4 *)(local_7e8 + uVar26);
                    local_9fc = *(undefined4 *)(local_838 + uVar26);
                    local_9f8 = *(undefined4 *)(local_828 + uVar26);
                    local_9f4 = *(undefined4 *)((long)&local_8a8 + uVar26);
                    local_9ec = (local_9d8.context)->instID[0];
                    local_9e8 = (local_9d8.context)->instPrimID[0];
                    local_a68._0_4_ = ray->tfar;
                    ray->tfar = *(float *)(local_818 + uVar26);
                    local_aac = -1;
                    local_9d8.valid = &local_aac;
                    local_9d8.geometryUserPtr = pGVar11->userPtr;
                    local_ac8 = ray;
                    local_9d8.hit = (RTCHitN *)&local_a08;
                    local_9d8.N = 1;
                    local_a78._0_8_ = pGVar11;
                    local_9d8.ray = (RTCRayN *)ray;
                    if (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_004c2167:
                      ray = local_ac8;
                      if ((pRVar28->filter == (RTCFilterFunctionN)0x0) ||
                         (((pRVar28->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          ((*(byte *)(local_a78._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_004c2271:
                        ray->tfar = -INFINITY;
                        return;
                      }
                      (*pRVar28->filter)(&local_9d8);
                      ray = local_ac8;
                      if (*local_9d8.valid != 0) goto LAB_004c2271;
                    }
                    else {
                      local_a88._0_8_ = pRVar28;
                      (*pGVar11->occlusionFilterN)(&local_9d8);
                      pRVar28 = (RTCIntersectArguments *)local_a88._0_8_;
                      if (*local_9d8.valid != 0) goto LAB_004c2167;
                    }
                    local_ac8->tfar = (float)local_a68._0_4_;
                    uVar19 = local_a48._0_8_ ^ 1L << (local_a58._0_8_ & 0x3f);
                    ray = local_ac8;
                    context = (RayQueryContext *)local_aa8._0_8_;
                    puVar29 = (ulong *)local_a28._0_8_;
                    uVar26 = local_a38._0_8_;
                  }
                } while (uVar19 != 0);
              }
            }
            local_a10 = local_a10 + 1;
            auVar91 = ZEXT1664(local_908);
            auVar96 = ZEXT1664(local_918);
            auVar97 = ZEXT1664(local_928);
            auVar99 = ZEXT1664(local_938);
            auVar100 = ZEXT1664(local_948);
            auVar103 = ZEXT1664(local_958);
            auVar105 = ZEXT1664(local_968);
            auVar107 = ZEXT1664(local_978);
          } while (local_a10 != local_a18);
        }
LAB_004c2261:
      } while (puVar29 != &local_7d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }